

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event_Report_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Event_Report_PDU::Decode(Event_Report_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT32 *T;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
  *this_00;
  KUINT16 KVar1;
  VariableDatum *pVVar2;
  KException *this_01;
  int iVar3;
  undefined7 in_register_00000011;
  ushort uVar4;
  KUINT32 datumID;
  KString local_60;
  Event_Report_PDU *local_40;
  KUINT32 *local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar3 = 0;
  }
  if (0x27 < iVar3 + (uint)KVar1) {
    Simulation_Management_Header::Decode((Simulation_Management_Header *)this,stream,ignoreHeader);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32EventType);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32Padding);
    T = &(this->super_Comment_PDU).m_ui32NumFixedDatum;
    KDataStream::Read<unsigned_int>(stream,T);
    local_38 = &(this->super_Comment_PDU).m_ui32NumVariableDatum;
    KDataStream::Read<unsigned_int>(stream,local_38);
    this_00 = &(this->super_Comment_PDU).m_vFixedDatum;
    local_40 = this;
    for (uVar4 = 0; (uint)uVar4 < *T; uVar4 = uVar4 + 1) {
      KVar1 = KDataStream::GetCurrentWritePosition(stream);
      KDataStream::Read<unsigned_int>(stream,&datumID);
      KDataStream::SetCurrentWritePosition(stream,KVar1);
      pVVar2 = (VariableDatum *)
               DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::FixedDatum>::FactoryDecode
                         (datumID,stream);
      if (pVVar2 == (VariableDatum *)0x0) {
        pVVar2 = (VariableDatum *)operator_new(0x10);
        DATA_TYPE::FixedDatum::FixedDatum((FixedDatum *)pVVar2,stream);
        local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00213af0;
        local_60._M_string_length = (size_type)pVVar2;
        local_60.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_60.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>>>
                    *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::FixedDatum> *)&local_60);
      }
      else {
        local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00213af0;
        local_60._M_string_length = (size_type)pVVar2;
        local_60.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_60.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>>>
                    *)this_00,(KRef_Ptr<KDIS::DATA_TYPE::FixedDatum> *)&local_60);
      }
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>::~KRef_Ptr
                ((KRef_Ptr<KDIS::DATA_TYPE::FixedDatum> *)&local_60);
    }
    local_40 = (Event_Report_PDU *)&(local_40->super_Comment_PDU).m_vVariableDatum;
    for (uVar4 = 0; (uint)uVar4 < *local_38; uVar4 = uVar4 + 1) {
      KVar1 = KDataStream::GetCurrentWritePosition(stream);
      KDataStream::Read<unsigned_int>(stream,&datumID);
      KDataStream::SetCurrentWritePosition(stream,KVar1);
      pVVar2 = DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::VariableDatum>::FactoryDecode
                         (datumID,stream);
      if (pVVar2 == (VariableDatum *)0x0) {
        pVVar2 = (VariableDatum *)operator_new(0x28);
        DATA_TYPE::VariableDatum::VariableDatum(pVVar2,stream);
        local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00211c60;
        local_60._M_string_length = (size_type)pVVar2;
        local_60.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_60.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>>
                    *)local_40,(KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)&local_60);
      }
      else {
        local_60._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00211c60;
        local_60._M_string_length = (size_type)pVVar2;
        local_60.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_60.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>>>
                    *)local_40,(KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)&local_60);
      }
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>::~KRef_Ptr
                ((KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)&local_60);
    }
    return;
  }
  this_01 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Decode",(allocator<char> *)&datumID);
  KException::KException(this_01,&local_60,2);
  __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
}

Assistant:

void Event_Report_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < EVENT_REPORT_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Simulation_Management_Header::Decode( stream, ignoreHeader );

    stream >> m_ui32EventType
           >> m_ui32Padding
           >> m_ui32NumFixedDatum
           >> m_ui32NumVariableDatum;

    // FixedDatum
    for( KUINT16 i = 0; i < m_ui32NumFixedDatum; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT32 datumID;

        // Extract the datum id then reset the stream.
        stream >> datumID;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        FixedDatum * p = FixedDatum::FactoryDecode( datumID, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vFixedDatum.push_back( FixDtmPtr( p ) );
        }
        else
        {
            // Default
            m_vFixedDatum.push_back( FixDtmPtr( new FixedDatum( stream ) ) );
        }
    }

    // VariableDatum
    for( KUINT16 i = 0; i < m_ui32NumVariableDatum; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT32 datumID;

        // Extract the datum id then reset the stream.
        stream >> datumID;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        VariableDatum * p = VariableDatum::FactoryDecode( datumID, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vVariableDatum.push_back( VarDtmPtr( p ) );
        }
        else
        {
            // Default
            m_vVariableDatum.push_back( VarDtmPtr( new VariableDatum( stream ) ) );
        }
    }
}